

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormapper.h
# Opt level: O2

vector<float,_std::allocator<float>_> *
irwincolor::rgb2hsv(vector<float,_std::allocator<float>_> *__return_storage_ptr__,
                   vector<float,_std::allocator<float>_> *rgb)

{
  float fVar1;
  float *pfVar2;
  pointer pfVar3;
  float fVar4;
  __type _Var5;
  float fVar6;
  float fVar7;
  float fVar8;
  allocator_type local_29;
  undefined1 local_28 [16];
  
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,3,&local_29);
  pfVar2 = (rgb->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  fVar7 = *pfVar2;
  fVar1 = pfVar2[1];
  fVar4 = pfVar2[2];
  fVar6 = fVar1;
  if (fVar7 <= fVar1) {
    fVar6 = fVar7;
  }
  fVar8 = fVar4;
  if (fVar6 <= fVar4) {
    fVar8 = fVar6;
  }
  if ((fVar7 <= fVar1) || (fVar7 <= fVar4)) {
    pfVar3 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((fVar1 <= fVar7) || (fVar1 <= fVar4)) {
      local_28._0_4_ = fVar4 - fVar8;
      pfVar3[2] = fVar4;
      fVar7 = 0.0;
      if (0.0 < (float)local_28._0_4_) {
        fVar7 = (*pfVar2 - pfVar2[1]) / (float)local_28._0_4_ + 4.0;
      }
    }
    else {
      pfVar3[2] = fVar1;
      local_28._0_4_ = fVar1 - fVar8;
      fVar7 = (pfVar2[2] - *pfVar2) / (float)local_28._0_4_ + 2.0;
      fVar4 = fVar1;
    }
  }
  else {
    (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_start[2] = fVar7;
    local_28 = ZEXT416((uint)(fVar7 - fVar8));
    _Var5 = std::fmod<float,double>((pfVar2[1] - pfVar2[2]) / (fVar7 - fVar8),6.0);
    fVar7 = (float)_Var5;
    pfVar3 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    fVar4 = pfVar3[2];
  }
  *pfVar3 = fVar7 * 60.0;
  pfVar3[1] = (float)(-(uint)(0.0 < fVar4) & (uint)((float)local_28._0_4_ / fVar4));
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> rgb2hsv(const std::vector<float>& rgb)
{
	std::vector<float> hsv(3);
	float m = std::min(std::min((double) rgb[0], (double) rgb[1]), (double) rgb[2]);
	float c, hp;
	if (rgb[0] > rgb[1] && rgb[0] > rgb[2])
	{
		c = rgb[0] - m;
		hsv[2] = rgb[0];
		hp = fmod((rgb[1] - rgb[2]) / c, 6.0);
	}
	else if (rgb[1] > rgb[2] && rgb[1] > rgb[0])
	{
		c = rgb[1] - m;
		hsv[2] = rgb[1];
		hp = (rgb[2] - rgb[0]) / c + 2.0;
	}
	else
	{
		c = rgb[2] - m;
		hsv[2] = rgb[2];
		hp = c <= 0.0 ? 0.0 : (rgb[0] - rgb[1]) / c + 4.0;
	}
	hsv[0] = hp * 60.0;
	hsv[1] = hsv[2] <= 0.0 ? 0.0 : c / hsv[2];
	return hsv;
}